

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

message * __thiscall gulps::message::print_message_abi_cxx11_(message *this,bool inc_text)

{
  byte in_DL;
  undefined7 in_register_00000031;
  undefined8 *puVar1;
  undefined1 local_80 [32];
  char *local_60;
  tm local_58;
  undefined1 local_1a;
  byte local_19;
  undefined8 *puStack_18;
  bool inc_text_local;
  message *this_local;
  string *out;
  
  puVar1 = (undefined8 *)CONCAT71(in_register_00000031,inc_text);
  local_19 = in_DL & 1;
  local_1a = 0;
  puStack_18 = puVar1;
  this_local = this;
  fmt::v5::localtime((v5 *)&local_58,(time_t *)*puVar1);
  local_60 = level_to_str(*(level *)(puVar1 + 1));
  fmt::v5::
  format<char[42],tm,char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long>
            ((v5 *)this,(char (*) [42])"{:%Y-%m-%d %H:%M:%S} {} [{}] {}.{} {}:{} ",&local_58,
             &local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 0xf),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 2),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 6),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 10),
             puVar1 + 0xe);
  if ((local_19 & 1) != 0) {
    print_text_abi_cxx11_((message *)local_80);
    std::__cxx11::string::operator+=((string *)this,(string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
  }
  return this;
}

Assistant:

std::string print_message(bool inc_text = true) const
		{
			std::string out = fmt::format("{:%Y-%m-%d %H:%M:%S} {} [{}] {}.{} {}:{} ", fmt::localtime(time), 
					level_to_str(lvl), thread_id, cat_major, cat_minor, src_path, src_line);

			if(inc_text)
				out += print_text();

			return out;
		}